

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::ObjectInstance(ParsedScene *this,string *name,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  FileLoc loc_01;
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  Transform *renderFromInstance;
  Transform worldFromRender;
  AnimatedTransform animatedRenderFromInstance;
  Transform local_848;
  InstanceSceneEntity local_7c8;
  Transform local_468;
  Transform local_3e8;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  if (this->currentBlock != OptionsBlock) {
    if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
      local_848.m.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[0];
      local_848.m.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[0] + 2);
      local_848.m.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[1];
      local_848.m.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[1] + 2);
      local_848.m.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[2];
      local_848.m.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[2] + 2);
      local_848.m.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[3];
      local_848.m.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[3] + 2);
      local_848.mInv.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[0];
      local_848.mInv.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[0] + 2);
      local_848.mInv.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[1];
      local_848.mInv.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[1] + 2);
      local_848.mInv.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[2];
      local_848.mInv.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[2] + 2);
      local_848.mInv.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[3];
      local_848.mInv.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[3] + 2);
      bVar5 = pbrt::Transform::operator!=
                        ((this->graphicsState).ctm.t,(this->graphicsState).ctm.t + 1);
      if (bVar5) {
        RenderFromObject(&local_368,this,0);
        pbrt::Transform::operator*((Transform *)&local_7c8,&local_368,&local_848);
        startTime = (this->graphicsState).transformStartTime;
        RenderFromObject(&local_468,this,1);
        pbrt::Transform::operator*(&local_3e8,&local_468,&local_848);
        AnimatedTransform::AnimatedTransform
                  (&local_2e8,(Transform *)&local_7c8,startTime,&local_3e8,
                   (this->graphicsState).transformEndTime);
        loc_00.filename._M_str = loc.filename._M_str;
        loc_00.filename._M_len = loc.filename._M_len;
        loc_00.line = loc.line;
        loc_00.column = loc.column;
        InstanceSceneEntity::InstanceSceneEntity(&local_7c8,name,loc_00,&local_2e8,(Transform *)0x0)
        ;
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
      }
      else {
        RenderFromObject(&local_2e8.startTransform,this,0);
        pbrt::Transform::operator*((Transform *)&local_7c8,&local_2e8.startTransform,&local_848);
        renderFromInstance = TransformCache::Lookup(&this->transformCache,(Transform *)&local_7c8);
        uVar3 = loc._16_8_;
        pcVar2 = loc.filename._M_str;
        sVar1 = loc.filename._M_len;
        memset(&local_2e8,0,0x2b8);
        AnimatedTransform::AnimatedTransform(&local_2e8);
        uVar4 = loc._16_8_;
        loc_01.filename._M_str = pcVar2;
        loc_01.filename._M_len = sVar1;
        loc.line = (int)uVar3;
        loc.column = SUB84(uVar3,4);
        loc_01.line = loc.line;
        loc_01.column = loc.column;
        loc._16_8_ = uVar4;
        InstanceSceneEntity::InstanceSceneEntity
                  (&local_7c8,name,loc_01,&local_2e8,renderFromInstance);
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_7c8.super_SceneEntity.parameters.params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.super_SceneEntity.name._M_dataplus._M_p !=
          &local_7c8.super_SceneEntity.name.field_2) {
        operator_delete(local_7c8.super_SceneEntity.name._M_dataplus._M_p,
                        local_7c8.super_SceneEntity.name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (this->super_SceneRepresentation).errorExit = true;
      Error(&loc,"ObjectInstance can\'t be called inside instance definition");
    }
    return;
  }
  ErrorExit<char_const(&)[15]>
            (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [15])"ObjectInstance");
}

Assistant:

void ParsedScene::ObjectInstance(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectInstance");

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc,
                          "ObjectInstance can't be called inside instance definition");
        return;
    }

    class Transform worldFromRender = Inverse(renderFromWorld);

    if (CTMIsAnimated()) {
        AnimatedTransform animatedRenderFromInstance(
            RenderFromObject(0) * worldFromRender, graphicsState.transformStartTime,
            RenderFromObject(1) * worldFromRender, graphicsState.transformEndTime);

        instances.push_back(
            InstanceSceneEntity(name, loc, animatedRenderFromInstance, nullptr));
    } else {
        const class Transform *renderFromInstance =
            transformCache.Lookup(RenderFromObject(0) * worldFromRender);

        instances.push_back(
            InstanceSceneEntity(name, loc, AnimatedTransform(), renderFromInstance));
    }
}